

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::PatchGetValueUsingSpecifiedInlineCache
              (InlineCache *inlineCache,Var instance,RecyclableObject *object,PropertyId propertyId,
              ScriptContext *scriptContext)

{
  bool bVar1;
  undefined1 local_90 [8];
  PropertyValueInfo info;
  Var value;
  
  local_90 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  PropertyValueInfo::SetCacheInfo((PropertyValueInfo *)local_90,inlineCache);
  bVar1 = CacheOperators::TryGetProperty<true,true,true,true,false,true,true,false,false,false>
                    (instance,false,object,propertyId,(Var *)&info.inlineCacheIndex,scriptContext,
                     (PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)local_90);
  if (!bVar1) {
    bVar1 = Phases::IsEnabled((Phases *)&DAT_015cd718,InlineCachePhase);
    if ((bVar1) && (DAT_015d346a == '\x01')) {
      CacheOperators::TraceCache(inlineCache,L"PatchGetValue",propertyId,scriptContext,object);
    }
    info._56_8_ = GetProperty(instance,object,propertyId,scriptContext,(PropertyValueInfo *)local_90
                             );
  }
  return (Var)info._56_8_;
}

Assistant:

Var JavascriptOperators::PatchGetValueUsingSpecifiedInlineCache(InlineCache * inlineCache, Var instance, RecyclableObject * object, PropertyId propertyId, ScriptContext* scriptContext)
    {
        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, inlineCache);
        Var value;
        if (CacheOperators::TryGetProperty<true, true, true, true, false, true, !InlineCache::IsPolymorphic, InlineCache::IsPolymorphic, false, false>(
                instance, false, object, propertyId, &value, scriptContext, nullptr, &info))
        {
            return value;
        }

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(inlineCache, _u("PatchGetValue"), propertyId, scriptContext, object);
        }
#endif

        return JavascriptOperators::GetProperty(instance, object, propertyId, scriptContext, &info);
    }